

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_timing.cpp
# Opt level: O0

void Am_Main_Event_Loop(void)

{
  Am_Time local_18;
  Am_Time local_10;
  Am_Time deadline;
  
  Am_Time::Am_Time(&local_10);
  while ((Am_Main_Loop_Go & 1U) != 0) {
    am_Handle_Timing_Events();
    Am_Time::operator=(&local_10,&local_18);
    Am_Time::~Am_Time(&local_18);
    Am_Update_All();
    Am_Drawonable::Process_Event(&local_10);
  }
  Am_Time::~Am_Time(&local_10);
  return;
}

Assistant:

void
Am_Main_Event_Loop()
{
  //// TODO: make exit when no windows are owned. (visible?)
  Am_Time deadline;
  while (Am_Main_Loop_Go) {
    deadline = am_Handle_Timing_Events();
    Am_Update_All();
    Am_Drawonable::Process_Event(deadline);
  }
}